

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::FileState::Read
          (FileState *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  long lVar1;
  ulong uVar2;
  unsigned_long uVar3;
  const_reference ppcVar4;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  Slice *in_R9;
  long in_FS_OFFSET;
  size_t avail;
  char *dst;
  size_t bytes_to_copy;
  size_t block_offset;
  size_t block;
  uint64_t available;
  MutexLock lock;
  Slice *in_stack_ffffffffffffff08;
  Slice *in_stack_ffffffffffffff10;
  Slice *in_stack_ffffffffffffff18;
  size_t local_c0;
  Slice *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff08,(Mutex *)0xd5d2a0);
  if (*(ulong *)(in_RSI + 0x70) < in_RDX) {
    Slice::Slice(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
    Slice::Slice(in_stack_ffffffffffffff08);
    Status::IOError(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else {
    uVar2 = *(long *)(in_RSI + 0x70) - in_RDX;
    local_70 = in_RCX;
    if (uVar2 < in_RCX) {
      local_70 = uVar2;
    }
    if (local_70 == 0) {
      Slice::Slice(in_stack_ffffffffffffff08);
      *in_R8 = local_40;
      in_R8[1] = uStack_38;
      Status::OK();
    }
    else {
      uVar3 = std::numeric_limits<unsigned_long>::max();
      if (uVar3 < in_RDX >> 0xd) {
        __assert_fail("offset / kBlockSize <= std::numeric_limits<size_t>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/helpers/memenv/memenv.cc"
                      ,0x56,
                      "Status leveldb::(anonymous namespace)::FileState::Read(uint64_t, size_t, Slice *, char *) const"
                     );
      }
      local_a8 = in_RDX & 0x1fff;
      local_b8 = in_R9;
      for (local_b0 = local_70; local_b0 != 0; local_b0 = local_b0 - local_c0) {
        local_c0 = 0x2000 - local_a8;
        if (local_b0 < local_c0) {
          local_c0 = local_b0;
        }
        in_stack_ffffffffffffff18 = local_b8;
        ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                            ((vector<char_*,_std::allocator<char_*>_> *)local_b8,
                             (size_type)in_stack_ffffffffffffff10);
        memcpy(in_stack_ffffffffffffff18,*ppcVar4 + local_a8,local_c0);
        local_b8 = (Slice *)((long)&local_b8->data_ + local_c0);
        local_a8 = 0;
      }
      Slice::Slice(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                   (size_t)in_stack_ffffffffffffff08);
      *in_R8 = local_50;
      in_R8[1] = uStack_48;
      Status::OK();
    }
  }
  MutexLock::~MutexLock((MutexLock *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result, char* scratch) const {
    MutexLock lock(&blocks_mutex_);
    if (offset > size_) {
      return Status::IOError("Offset greater than file size.");
    }
    const uint64_t available = size_ - offset;
    if (n > available) {
      n = static_cast<size_t>(available);
    }
    if (n == 0) {
      *result = Slice();
      return Status::OK();
    }

    assert(offset / kBlockSize <= std::numeric_limits<size_t>::max());
    size_t block = static_cast<size_t>(offset / kBlockSize);
    size_t block_offset = offset % kBlockSize;
    size_t bytes_to_copy = n;
    char* dst = scratch;

    while (bytes_to_copy > 0) {
      size_t avail = kBlockSize - block_offset;
      if (avail > bytes_to_copy) {
        avail = bytes_to_copy;
      }
      memcpy(dst, blocks_[block] + block_offset, avail);

      bytes_to_copy -= avail;
      dst += avail;
      block++;
      block_offset = 0;
    }

    *result = Slice(scratch, n);
    return Status::OK();
  }